

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEDate.cpp
# Opt level: O3

bool __thiscall test_CEDate::test_constructor(test_CEDate *this)

{
  CEDate *other;
  double dVar1;
  undefined1 uVar2;
  initializer_list<double> __l;
  double jd_20190101;
  CEDate test5;
  CEDate test4;
  CEDate test2;
  vector<double,_std::allocator<double>_> greg_20190101;
  CEDate test3;
  CEDate test1;
  allocator local_1bd;
  undefined4 local_1bc;
  double local_1b8;
  double local_1b0;
  double local_1a8 [4];
  CEDate local_188;
  CEDate local_148;
  CEDate local_108;
  vector<double,_std::allocator<double>_> local_c8;
  vector<double,_std::allocator<double>_> local_b0;
  CEDate local_98;
  CEDate local_58;
  
  local_58.mod_julian_date_ = 1.0;
  local_58.gregorian_date_ = 0.5;
  local_58._vptr_CEDate = (_func_int **)0x409f8c0000000000;
  local_58.julian_date_ = 1.0;
  std::allocator<double>::allocator((allocator<double> *)&local_108);
  __l._M_len = 4;
  __l._M_array = (iterator)&local_58;
  std::vector<double,_std::allocator<double>_>::vector(&local_b0,__l,(allocator_type *)&local_108);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_108);
  local_1b0 = 2458485.0;
  dVar1 = CEDate::CurrentJD();
  CEDate::CEDate(&local_58,dVar1,JD);
  local_98._vptr_CEDate = (_func_int **)CEDate::JD(&local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"test_constructor",(allocator *)&local_188);
  local_148._vptr_CEDate = (_func_int **)CONCAT44(local_148._vptr_CEDate._4_4_,0x4e);
  CETestSuite::test_greaterthan
            ((double *)this,(double *)&local_98,(string *)&local_1b0,(int *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_188);
  other = &this->base_date_;
  CEDate::CEDate(&local_108,other);
  local_148._vptr_CEDate = (_func_int **)CEDate::JD(&local_108);
  local_188._vptr_CEDate = (_func_int **)CEDate::JD(other);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"test_constructor",(allocator *)&local_1b8);
  local_1a8[0] = (double)CONCAT44(local_1a8[0]._4_4_,0x52);
  (**(code **)(*(long *)this + 0x58))(this,&local_148,&local_188,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1b8);
  dVar1 = CEDate::operator_cast_to_double(other);
  CEDate::CEDate(&local_98,dVar1,JD);
  local_188._vptr_CEDate = (_func_int **)CEDate::JD(&local_98);
  local_1a8[0] = CEDate::JD(other);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"test_constructor",(allocator *)&local_1bc);
  local_1b8._0_4_ = 0x56;
  (**(code **)(*(long *)this + 0x58))(this,&local_188,local_1a8,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1bc);
  std::vector<double,_std::allocator<double>_>::vector(&local_c8,&local_b0);
  CEDate::CEDate(&local_148,&local_c8);
  std::vector<double,_std::allocator<double>_>::~vector(&local_c8);
  local_1a8[0] = CEDate::JD(&local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_188,"test_constructor",(allocator *)&local_1bc);
  local_1b8 = (double)CONCAT44(local_1b8._4_4_,0x5a);
  (**(code **)(*(long *)this + 0x58))(this,local_1a8,&local_1b0,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1bc);
  CEDate::CEDate(&local_188,local_1b0,JD);
  local_1b8 = CEDate::JD(&local_188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_1a8,"test_constructor",&local_1bd);
  local_1bc = 0x5e;
  (**(code **)(*(long *)this + 0x58))(this,&local_1b8,&local_1b0,local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1bd);
  uVar2 = (**(code **)(*(long *)this + 0x18))(this);
  CEDate::~CEDate(&local_188);
  CEDate::~CEDate(&local_148);
  CEDate::~CEDate(&local_98);
  CEDate::~CEDate(&local_108);
  CEDate::~CEDate(&local_58);
  std::vector<double,_std::allocator<double>_>::~vector(&local_b0);
  return (bool)uVar2;
}

Assistant:

bool test_CEDate::test_constructor(void)
{
    // Values for testing
    std::vector<double> greg_20190101 = {2019, 1.0, 1.0, 0.5};
    double              jd_20190101   = 2458485.0;

    // Default constructor. Because the default date is given as the current
    // date, the check is just that the value is greater than 01-01-2019
    CEDate test1;
    test_greaterthan(test1.JD(), jd_20190101, __func__, __LINE__);

    // Copy constructor
    CEDate test2(base_date_);
    test_double(test2.JD(), base_date_.JD(), __func__, __LINE__);

    // Copy assignment operator
    CEDate test3 = base_date_;
    test_double(test3.JD(), base_date_.JD(), __func__, __LINE__);

    // Construct from a vector
    CEDate test4(greg_20190101);
    test_double(test4.JD(), jd_20190101, __func__, __LINE__);

    // Construct from a Julian date
    CEDate test5(jd_20190101);
    test_double(test5.JD(), jd_20190101, __func__, __LINE__);

    return pass();
}